

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O1

void __thiscall
lineage::heuristics::
PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
::PartitionOptimizerBase
          (PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
           *this,Data *data,Solution *initialSolution)

{
  Data *pDVar1;
  ProblemGraph *pPVar2;
  pointer pEVar3;
  pointer puVar4;
  long lVar5;
  ulong in_RAX;
  Value *pVVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  undefined8 uStack_38;
  
  (this->super_HeuristicBase).data_ = data;
  (this->super_HeuristicBase).silent_ = false;
  (this->super_HeuristicBase)._vptr_HeuristicBase = (_func_int **)&PTR_optimize_0014c820;
  uStack_38 = in_RAX;
  PartitionGraph::PartitionGraph<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&this->partitionGraph_,data,&initialSolution->edge_labels);
  this->totalBranching_ = 0.0;
  this->localBranchingObjective_ = 0.0;
  this->internalObjective_ = 0.0;
  this->branchingObjective_ = 0.0;
  uStack_38 = uStack_38 & 0xffffffffffffff;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->swapped_,
             (long)(data->problemGraph->graph_).vertices_.
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(data->problemGraph->graph_).vertices_.
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(bool *)((long)&uStack_38 + 7),
             (allocator_type *)((long)&uStack_38 + 6));
  uStack_38._0_6_ = (uint6)(uint5)uStack_38;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->visited_,
             (long)(data->problemGraph->graph_).vertices_.
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(data->problemGraph->graph_).vertices_.
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(bool *)((long)&uStack_38 + 5),
             (allocator_type *)((long)&uStack_38 + 4));
  (this->changed_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->changed_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->changed_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->changed_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->needsUpdate_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->needsUpdate_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->needsUpdate_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->changed_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->needsUpdate_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->needsUpdate_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->bestVertexLabels_,&(this->partitionGraph_).vertexLabels_);
  pDVar1 = (this->super_HeuristicBase).data_;
  pPVar2 = pDVar1->problemGraph;
  pEVar3 = (pPVar2->graph_).edges_.
           super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(pPVar2->graph_).edges_.
                super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar3;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 4;
    dVar9 = this->internalObjective_;
    dVar10 = this->totalBranching_;
    puVar4 = (this->partitionGraph_).vertexLabels_.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar6 = pEVar3->vertexIndices_ + 1;
    lVar8 = 0;
    do {
      if (puVar4[((Edge<false,_unsigned_long> *)(pVVar6 + -1))->vertexIndices_[0]] !=
          puVar4[*pVVar6]) {
        lVar5 = (long)(pPVar2->problem_->nodes).
                      super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
                      super__Vector_impl_data._M_start;
        if (*(int *)(lVar5 + ((Edge<false,_unsigned_long> *)(pVVar6 + -1))->vertexIndices_[0] * 0x18
                    ) == *(int *)(lVar5 + *pVVar6 * 0x18)) {
          dVar9 = dVar9 + (pDVar1->costs).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar8];
          this->internalObjective_ = dVar9;
        }
        else {
          dVar10 = dVar10 + (pDVar1->costs).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar8];
          this->totalBranching_ = dVar10;
        }
      }
      lVar8 = lVar8 + 1;
      pVVar6 = pVVar6 + 2;
    } while (lVar7 + (ulong)(lVar7 == 0) != lVar8);
  }
  solveFullBranchingProblemAndUpdateLabels(this);
  HeuristicBase::logObj(&this->super_HeuristicBase);
  return;
}

Assistant:

PartitionOptimizerBase(Data& data, Solution initialSolution)
      : HeuristicBase(data)
      , partitionGraph_(data, initialSolution.edge_labels)
      , swapped_(data.problemGraph.graph().numberOfVertices(), false)
      , visited_(data.problemGraph.graph().numberOfVertices(), false)
      , bestVertexLabels_(partitionGraph_.vertexLabels_)
    {
        // initialize internal objective.
        for (size_t edge = 0;
             edge < this->data_.problemGraph.graph().numberOfEdges(); ++edge) {
            const auto v0 =
                this->data_.problemGraph.graph().vertexOfEdge(edge, 0);
            const auto v1 =
                this->data_.problemGraph.graph().vertexOfEdge(edge, 1);

            if (partitionGraph_.vertexLabels_[v0] ==
                partitionGraph_.vertexLabels_[v1]) {
                continue;
            }

            if (this->data_.problemGraph.frameOfNode(v0) ==
                this->data_.problemGraph.frameOfNode(v1)) {
                internalObjective_ += this->data_.costs[edge];
            } else {
                totalBranching_ += this->data_.costs[edge];
            }
        }

        // optimal branching for initial partitioning.
        solveFullBranchingProblemAndUpdateLabels();

        this->logObj();
    }